

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

void chaiscript::detail::Dispatch_Engine::pop_scope(Stack_Holder *t_holder)

{
  pointer pvVar1;
  pointer pQVar2;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *this;
  
  this = (t_holder->call_params).
         super__Vector_base<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_std::allocator<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
  (t_holder->call_params).
  super__Vector_base<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_std::allocator<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = this;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(this);
  pvVar1 = (t_holder->stacks).
           super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pQVar2 = pvVar1[-1].
           super__Vector_base<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar1[-1].
      super__Vector_base<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pQVar2) {
    pvVar1[-1].
    super__Vector_base<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pQVar2 + -1;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
    ::~vector(&pQVar2[-1].data);
    return;
  }
  __assert_fail("!stack.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/dispatchkit/dispatchkit.hpp"
                ,0x1e7,"static void chaiscript::detail::Dispatch_Engine::pop_scope(Stack_Holder &)")
  ;
}

Assistant:

static void pop_scope(Stack_Holder &t_holder) {
        t_holder.call_params.pop_back();
        StackData &stack = get_stack_data(t_holder);

        assert(!stack.empty());

        stack.pop_back();
      }